

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O2

char * __thiscall
CVmObjString::cons_append(CVmObjString *this,char *ptr,char *addstr,size_t addlen,size_t margin)

{
  char *__dest;
  
  __dest = cons_ensure_space(this,ptr,addlen,margin);
  memcpy(__dest,addstr,addlen);
  return __dest + addlen;
}

Assistant:

char *CVmObjString::cons_append(VMG_ char *ptr,
                                const char *addstr, size_t addlen,
                                size_t margin)
{
    /* ensure we have space for the added string */
    ptr = cons_ensure_space(vmg_ ptr, addlen, margin);

    /* add the new string onto the end of the buffer */
    memcpy(ptr, addstr, addlen);

    /* return a pointer to the end of the added data */
    return ptr + addlen;
}